

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O2

void __thiscall cmCTestLaunchReporter::ComputeFileNames(cmCTestLaunchReporter *this)

{
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  string *realArg;
  pointer pbVar4;
  string_view input;
  string_view input_00;
  cmCryptoHash md5;
  string d;
  cmCryptoHash local_d0;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  bVar3 = cmsys::SystemTools::GetEnv("CTEST_LAUNCH_LOGS",&local_c0);
  if (bVar3 && local_c0._M_string_length != 0) {
    this->Passthru = false;
    psVar1 = &this->LogDir;
    std::__cxx11::string::_M_assign((string *)psVar1);
    cmsys::SystemTools::ConvertToUnixSlashes(psVar1);
    std::__cxx11::string::append((char *)psVar1);
    cmCryptoHash::cmCryptoHash(&local_d0,AlgoMD5);
    cmCryptoHash::Initialize(&local_d0);
    input._M_str = (this->CWD)._M_dataplus._M_p;
    input._M_len = (this->CWD)._M_string_length;
    cmCryptoHash::Append(&local_d0,input);
    pbVar2 = (this->RealArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->RealArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1)
    {
      input_00._M_str = (pbVar4->_M_dataplus)._M_p;
      input_00._M_len = pbVar4->_M_string_length;
      cmCryptoHash::Append(&local_d0,input_00);
    }
    cmCryptoHash::FinalizeHex_abi_cxx11_((string *)&local_80,&local_d0);
    psVar1 = &this->LogHash;
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    local_80.View_._M_str = (this->LogDir)._M_dataplus._M_p;
    local_80.View_._M_len = (this->LogDir)._M_string_length;
    local_50.View_._M_len = 7;
    local_50.View_._M_str = "launch-";
    cmStrCat<std::__cxx11::string,char[9]>
              (&local_a0,&local_80,&local_50,psVar1,(char (*) [9])"-out.txt");
    std::__cxx11::string::operator=((string *)&this->LogOut,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    local_80.View_._M_str = (this->LogDir)._M_dataplus._M_p;
    local_80.View_._M_len = (this->LogDir)._M_string_length;
    local_50.View_._M_len = 7;
    local_50.View_._M_str = "launch-";
    cmStrCat<std::__cxx11::string,char[9]>
              (&local_a0,&local_80,&local_50,psVar1,(char (*) [9])"-err.txt");
    std::__cxx11::string::operator=((string *)&this->LogErr,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    cmCryptoHash::~cmCryptoHash(&local_d0);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void cmCTestLaunchReporter::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  std::string d;
  if (!cmSystemTools::GetEnv("CTEST_LAUNCH_LOGS", d) || d.empty()) {
    return;
  }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  cmCryptoHash md5(cmCryptoHash::AlgoMD5);
  md5.Initialize();
  md5.Append(this->CWD);
  for (std::string const& realArg : this->RealArgs) {
    md5.Append(realArg);
  }
  this->LogHash = md5.FinalizeHex();

  // We store stdout and stderr in temporary log files.
  this->LogOut = cmStrCat(this->LogDir, "launch-", this->LogHash, "-out.txt");
  this->LogErr = cmStrCat(this->LogDir, "launch-", this->LogHash, "-err.txt");
}